

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

void __thiscall Shell::Run(Shell *this)

{
  bool bVar1;
  char *this_00;
  CommandSptr cmd;
  string s;
  undefined8 *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  string local_70;
  string local_50 [32];
  
  while( true ) {
    std::operator<<((ostream *)&std::cout,this->path);
    this_00 = "$ ";
    std::operator<<((ostream *)&std::cout,"$ ");
    GetCommand_abi_cxx11_(&local_70,(Shell *)this_00);
    bVar1 = std::operator==(&local_70,"exit");
    if (bVar1) break;
    std::__cxx11::string::string(local_50,(string *)&local_70);
    CmdParser::Parse((CmdParser *)&local_80,(string *)this);
    std::__cxx11::string::~string(local_50);
    if (local_80 != (undefined8 *)0x0) {
      (**(code **)*local_80)();
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void Shell::Run(){
	while(true){
		cout << path;
		cout << "$ ";
		auto s = GetCommand();
		if(s == "exit")break;
		auto cmd = cmdPsr.Parse(s);
		if(cmd != nullptr)cmd->Execute();
	}
}